

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O1

bool __thiscall
Market::match(Market *this,queue<Order,_std::deque<Order,_std::allocator<Order>_>_> *orders)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  const_iterator __position;
  const_iterator __position_00;
  _Map_pointer ppOVar3;
  Order *bid;
  Market *this_00;
  Order *ask;
  byte local_51;
  
  this_00 = this;
  do {
    if (((this->m_bidOrders)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
       ((this->m_askOrders)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
      ppOVar3 = (orders->c).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      local_51 = ((long)(orders->c).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur -
                  (long)(orders->c).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_first >> 6) * -0x5555555555555555 +
                 (((long)ppOVar3 -
                   (long)(orders->c).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
                         super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                 (ulong)(ppOVar3 == (_Map_pointer)0x0)) * 2 !=
                 ((long)(orders->c).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
                        super__Deque_impl_data._M_start._M_last -
                  (long)(orders->c).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur >> 6) * 0x5555555555555555;
      break;
    }
    __position._M_node = (this->m_bidOrders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    __position_00._M_node = (this->m_askOrders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
    ;
    p_Var1 = __position._M_node[5]._M_left;
    p_Var2 = __position_00._M_node[5]._M_left;
    if ((double)p_Var1 < (double)p_Var2) {
      ppOVar3 = (orders->c).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      local_51 = ((long)(orders->c).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur -
                  (long)(orders->c).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_first >> 6) * -0x5555555555555555 +
                 (((long)ppOVar3 -
                   (long)(orders->c).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
                         super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                 (ulong)(ppOVar3 == (_Map_pointer)0x0)) * 2 !=
                 ((long)(orders->c).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
                        super__Deque_impl_data._M_start._M_last -
                  (long)(orders->c).super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur >> 6) * 0x5555555555555555;
    }
    else {
      match(this_00,(Order *)&__position._M_node[1]._M_parent,
            (Order *)&__position_00._M_node[1]._M_parent);
      std::deque<Order,_std::allocator<Order>_>::push_back
                (&orders->c,(value_type *)&__position._M_node[1]._M_parent);
      this_00 = (Market *)orders;
      std::deque<Order,_std::allocator<Order>_>::push_back
                (&orders->c,(value_type *)&__position_00._M_node[1]._M_parent);
      if (*(long *)(__position._M_node + 6) == 0) {
        this_00 = (Market *)&this->m_bidOrders;
        std::
        _Rb_tree<double,_std::pair<const_double,_Order>,_std::_Select1st<std::pair<const_double,_Order>_>,_std::greater<double>,_std::allocator<std::pair<const_double,_Order>_>_>
        ::_M_erase_aux(&(this->m_bidOrders)._M_t,__position);
      }
      if (*(long *)(__position_00._M_node + 6) == 0) {
        this_00 = (Market *)&this->m_askOrders;
        std::
        _Rb_tree<double,_std::pair<const_double,_Order>,_std::_Select1st<std::pair<const_double,_Order>_>,_std::less<double>,_std::allocator<std::pair<const_double,_Order>_>_>
        ::_M_erase_aux(&(this->m_askOrders)._M_t,__position_00);
      }
    }
  } while ((double)p_Var2 <= (double)p_Var1);
  return (bool)(local_51 & 1);
}

Assistant:

bool Market::match(std::queue<Order> &orders) {
  while (true) {
    if (!m_bidOrders.size() || !m_askOrders.size()) {
      return orders.size() != 0;
    }

    BidOrders::iterator iBid = m_bidOrders.begin();
    AskOrders::iterator iAsk = m_askOrders.begin();

    if (iBid->second.getPrice() >= iAsk->second.getPrice()) {
      Order &bid = iBid->second;
      Order &ask = iAsk->second;

      match(bid, ask);
      orders.push(bid);
      orders.push(ask);

      if (bid.isClosed()) {
        m_bidOrders.erase(iBid);
      }
      if (ask.isClosed()) {
        m_askOrders.erase(iAsk);
      }
    } else {
      return orders.size() != 0;
    }
  }
}